

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AZHighLevelEncoder.cpp
# Opt level: O0

int ZXing::Aztec::CalculateBinaryShiftCost(EncodingState *state)

{
  EncodingState *state_local;
  int local_4;
  
  if (state->binaryShiftByteCount < 0x3f) {
    if (state->binaryShiftByteCount < 0x20) {
      if (state->binaryShiftByteCount < 1) {
        local_4 = 0;
      }
      else {
        local_4 = 10;
      }
    }
    else {
      local_4 = 0x14;
    }
  }
  else {
    local_4 = 0x15;
  }
  return local_4;
}

Assistant:

static int CalculateBinaryShiftCost(const EncodingState& state)
{
	if (state.binaryShiftByteCount > 62) {
		return 21; // B/S with extended length
	}
	if (state.binaryShiftByteCount > 31) {
		return 20; // two B/S
	}
	if (state.binaryShiftByteCount > 0) {
		return 10; // one B/S
	}
	return 0;
}